

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::
     PostWalker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
     ::scan(HashStringifyWalker *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  Binary *pBVar5;
  ContBind *pCVar6;
  RefI31 *pRVar7;
  TableGet *pTVar8;
  CallRef *pCVar9;
  LocalSet *pLVar10;
  Call *pCVar11;
  ArrayInitData *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Switch *pSVar16;
  ArrayNew *pAVar17;
  Return *pRVar18;
  StructNew *pSVar19;
  BrOn *pBVar20;
  Suspend *pSVar21;
  Store *pSVar22;
  Throw *pTVar23;
  StringWTF16Get *pSVar24;
  ResumeThrow *pRVar25;
  TupleMake *pTVar26;
  ArrayNewFixed *pAVar27;
  Binary *currp_00;
  ulong uVar28;
  Break *pBVar29;
  StringConcat *currp_01;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar28 = (ulong)*(uint *)(pBVar1 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pBVar1 + 0x20),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitIf,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::If>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
                    (Expression **)((If *)pSVar24 + 0x20));
    goto LAB_001d442c;
  case LoopId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitLoop,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_001d4005;
  case BreakId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitBreak,currp);
    pBVar29 = Expression::cast<wasm::Break>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
                    (Expression **)(pBVar29 + 0x28));
    pBVar29 = pBVar29 + 0x20;
    goto LAB_001d3eff;
  case SwitchId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSwitch,currp);
    pSVar16 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pSVar16 + 0x48));
    pBVar29 = (Break *)(pSVar16 + 0x40);
    goto LAB_001d3eff;
  case CallId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar28 = (ulong)*(uint *)(pCVar11 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar11 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pCVar13 + 0x38));
    uVar28 = (ulong)*(uint *)(pCVar13 + 0x20);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar13 + 0x18),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitLocalSet,currp);
    pLVar10 = Expression::cast<wasm::LocalSet>(this);
    goto LAB_001d425d;
  case GlobalGetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitGlobalSet,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_001d4005;
  case LoadId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    currp_01 = (StringConcat *)(pLVar14 + 0x30);
    goto LAB_001d4444;
  case StoreId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_001d4224;
  case ConstId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitUnary,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::Unary>(this);
    goto LAB_001d425d;
  case BinaryId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitBinary,currp);
    pBVar5 = Expression::cast<wasm::Binary>(this);
    goto LAB_001d41c6;
  case SelectId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSelect,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::Select>(this);
    goto LAB_001d441d;
  case DropId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitDrop,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::Drop>(this);
    goto LAB_001d4096;
  case ReturnId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitReturn,currp);
    pRVar18 = Expression::cast<wasm::Return>(this);
    pBVar29 = (Break *)&pRVar18->value;
    goto LAB_001d3eff;
  case MemorySizeId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitMemoryGrow,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_001d4096;
  case NopId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitAtomicRMW,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_001d42a4;
  case AtomicCmpxchgId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitAtomicCmpxchg,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_001d4295;
  case AtomicWaitId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitAtomicWait,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_001d4025;
  case AtomicNotifyId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitAtomicNotify,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_001d41c6;
  case AtomicFenceId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDExtract,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_001d425d;
  case SIMDReplaceId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDReplace,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = pBVar5 + 1;
    goto LAB_001d41d4;
  case SIMDShuffleId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDShuffle,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_001d442c;
  case SIMDTernaryId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDTernary,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_001d4025;
  case SIMDShiftId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDShift,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_001d41c6;
  case SIMDLoadId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDLoad,currp);
    pBVar20 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_001d4160;
  case SIMDLoadStoreLaneId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_001d4224:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pSVar22 + 0x38));
    currp_01 = (StringConcat *)(pSVar22 + 0x30);
    goto LAB_001d4444;
  case MemoryInitId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitMemoryInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_001d4295;
  case DataDropId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitMemoryCopy,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_001d441d;
  case MemoryFillId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitMemoryFill,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_001d441d;
  case PopId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefIsNull,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_001d4096;
  case RefFuncId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefEq,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::RefEq>(this);
    goto LAB_001d442c;
  case TableGetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableGet,currp);
    pTVar8 = Expression::cast<wasm::TableGet>(this);
LAB_001d4005:
    currp_01 = (StringConcat *)(pTVar8 + 0x20);
    goto LAB_001d4444;
  case TableSetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableSet,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableSet>(this);
    goto LAB_001d42a4;
  case TableSizeId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableGrow,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_001d42a4;
  case TableFillId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableFill,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableFill>(this);
    goto LAB_001d4295;
  case TableCopyId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableCopy,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_001d441d;
  case TableInitId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTableInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableInit>(this);
    goto LAB_001d4295;
  case TryId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar28 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    currp_01 = (StringConcat *)&pTVar15->body;
    goto LAB_001d4444;
  case TryTableId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTryTable,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TryTable>(this);
    goto LAB_001d4096;
  case ThrowId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar28 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar23 + 0x20),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitThrowRef,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_001d4096;
  case TupleMakeId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTupleMake,currp);
    pTVar26 = Expression::cast<wasm::TupleMake>(this);
    uVar28 = (ulong)*(uint *)(pTVar26 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar26 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitTupleExtract,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_001d4096;
  case RefI31Id:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefI31,currp);
    pRVar7 = Expression::cast<wasm::RefI31>(this);
    goto LAB_001d4096;
  case I31GetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitI31Get,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::I31Get>(this);
    goto LAB_001d4096;
  case CallRefId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pCVar9 + 0x30));
    uVar28 = (ulong)*(uint *)(pCVar9 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar9 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefTest,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefTest>(this);
    goto LAB_001d4096;
  case RefCastId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefCast,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefCast>(this);
    goto LAB_001d4096;
  case BrOnId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitBrOn,currp);
    pBVar20 = Expression::cast<wasm::BrOn>(this);
LAB_001d4160:
    currp_01 = (StringConcat *)(pBVar20 + 0x28);
    goto LAB_001d4444;
  case StructNewId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStructNew,currp);
    pSVar19 = Expression::cast<wasm::StructNew>(this);
    uVar28 = (ulong)*(uint *)(pSVar19 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar19 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStructGet,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::StructGet>(this);
    goto LAB_001d425d;
  case StructSetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStructSet,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructSet>(this);
    goto LAB_001d41c6;
  case StructRMWId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStructRMW,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_001d41c6;
  case StructCmpxchgId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStructCmpxchg,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_001d4025:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,(Expression **)(pBVar5 + 1))
    ;
LAB_001d403e:
    currp_00 = (Binary *)&pBVar5->right;
    goto LAB_001d41d4;
  case ArrayNewId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayNew,currp);
    pAVar17 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pAVar17 + 0x18));
    pBVar29 = (Break *)(pAVar17 + 0x10);
LAB_001d3eff:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,(Expression **)pBVar29)
    ;
    return;
  case ArrayNewDataId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayNewData,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_001d42a4;
  case ArrayNewElemId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayNewElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_001d42a4;
  case ArrayNewFixedId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayNewFixed,currp);
    pAVar27 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar28 = (ulong)*(uint *)(pAVar27 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pAVar27 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayGet,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_001d442c;
  case ArraySetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArraySet,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_001d441d;
  case ArrayLenId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayLen,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_001d4096;
  case ArrayCopyId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayCopy,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)((ArrayCopy *)pSVar24 + 0x30));
    goto LAB_001d440e;
  case ArrayFillId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayFill,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayFill>(this);
LAB_001d440e:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)((StringConcat *)pSVar24 + 0x28));
    goto LAB_001d441d;
  case ArrayInitDataId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayInitData,currp);
    pAVar12 = Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_001d3b6b;
  case ArrayInitElemId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitArrayInitElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_001d3b6b:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pAVar12 + 0x38));
LAB_001d4295:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pAVar12 + 0x30));
LAB_001d42a4:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pAVar12 + 0x28));
    currp_01 = (StringConcat *)(pAVar12 + 0x20);
    goto LAB_001d4444;
  case RefAsId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitRefAs,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_001d425d;
  case StringNewId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringNew,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StringNew>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
                    (Expression **)(pBVar5 + 1));
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,&pBVar5->right);
    goto LAB_001d41df;
  case StringConstId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringMeasure,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::StringMeasure>(this);
LAB_001d425d:
    currp_01 = (StringConcat *)&pLVar10->value;
    goto LAB_001d4444;
  case StringEncodeId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringEncode,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::maybePushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                     *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
                    (Expression **)(pBVar5 + 1));
    goto LAB_001d403e;
  case StringConcatId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringConcat,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_001d442c;
  case StringEqId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringEq,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StringEq>(this);
LAB_001d41c6:
    currp_00 = (Binary *)&pBVar5->right;
LAB_001d41d4:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,(Expression **)currp_00);
LAB_001d41df:
    currp_01 = (StringConcat *)&pBVar5->left;
    goto LAB_001d4444;
  case StringWTF16GetId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringWTF16Get,currp);
    pSVar24 = Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_001d442c;
  case StringSliceWTFId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStringSliceWTF,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_001d441d:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)((StringConcat *)pSVar24 + 0x20));
LAB_001d442c:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)((StringConcat *)pSVar24 + 0x18));
    currp_01 = (StringConcat *)pSVar24 + 0x10;
    goto LAB_001d4444;
  case ContNewId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitContNew,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ContNew>(this);
LAB_001d4096:
    currp_01 = (StringConcat *)(pRVar7 + 0x10);
LAB_001d4444:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,(Expression **)currp_01);
    return;
  case ContBindId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pCVar6 + 0x30));
    uVar28 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitSuspend,currp);
    pSVar21 = Expression::cast<wasm::Suspend>(this);
    uVar28 = (ulong)*(uint *)(pSVar21 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar21 + 0x20),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pRVar2 + 0x70));
    uVar28 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitResumeThrow,currp);
    pRVar25 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pRVar25 + 0x80));
    uVar28 = (ulong)*(uint *)(pRVar25 + 0x68);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar25 + 0x60),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                       ::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,
               (Expression **)(pSVar3 + 0x40));
    uVar28 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar28);
      Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)self,StringifyWalker<wasm::HashStringifyWalker>::scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }